

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

bool __thiscall
pybind11::detail::
map_caster<std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(map_caster<std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  PyObject *src_00;
  bool bVar1;
  int iVar2;
  bool bVar3;
  type_caster<unsigned_int,_void> local_7c;
  undefined8 uStack_78;
  key_conv kconv;
  dict_iterator __begin3;
  value_conv vconv;
  dict d;
  
  if ((src.m_ptr == (PyObject *)0x0) || (((src.m_ptr)->ob_type->tp_flags & 0x20000000) == 0)) {
    bVar3 = false;
  }
  else {
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    vconv.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._8_8_ = src.m_ptr;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this);
    uStack_78 = vconv.
                super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                .value.field_2._8_8_;
    __begin3.super_dict_readonly.obj.m_ptr = (PyObject *)0x0;
    __begin3.super_dict_readonly.key = (PyObject *)0x0;
    __begin3.super_dict_readonly.value = (PyObject *)0x0;
    iVar2 = PyDict_Next();
    if (iVar2 == 0) {
      __begin3.super_dict_readonly.value = (PyObject *)0xffffffffffffffff;
    }
    bVar3 = __begin3.super_dict_readonly.value == (PyObject *)0xffffffffffffffff;
    if (!bVar3) {
      do {
        src_00 = __begin3.super_dict_readonly.key;
        __begin3.super_dict_readonly.pos =
             (ssize_t)&vconv.
                       super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       .value._M_string_length;
        vconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_dataplus._M_p = (pointer)0x0;
        vconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_string_length._0_1_ = 0;
        bVar1 = type_caster<unsigned_int,_void>::load
                          (&local_7c,__begin3.super_dict_readonly.obj,convert);
        if ((!bVar1) ||
           (bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            *)&__begin3.super_dict_readonly.pos,(handle)src_00,convert), !bVar1)) {
          if ((size_type *)__begin3.super_dict_readonly.pos !=
              &vconv.
               super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               .value._M_string_length) {
            operator_delete((void *)__begin3.super_dict_readonly.pos,
                            CONCAT71(vconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length._1_7_,
                                     (undefined1)
                                     vconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length) + 1);
          }
          break;
        }
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<unsigned_int,std::__cxx11::string>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                    *)this,&local_7c.value,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__begin3.super_dict_readonly.pos);
        if ((size_type *)__begin3.super_dict_readonly.pos !=
            &vconv.
             super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .value._M_string_length) {
          operator_delete((void *)__begin3.super_dict_readonly.pos,
                          CONCAT71(vconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   vconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        iVar2 = PyDict_Next(uStack_78,&__begin3.super_dict_readonly.value,&__begin3,
                            &__begin3.super_dict_readonly.key);
        if (iVar2 == 0) {
          __begin3.super_dict_readonly.value = (PyObject *)0xffffffffffffffff;
        }
        bVar3 = __begin3.super_dict_readonly.value == (PyObject *)0xffffffffffffffff;
      } while (!bVar3);
    }
    object::~object((object *)
                    ((long)&vconv.
                            super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            .value.field_2 + 8));
  }
  return bVar3;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }